

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O3

NeuralNetwork *
buildBasicNeuralNetworkModel
          (Model *m,bool isUpdatable,TensorAttributes *inTensorAttr,TensorAttributes *outTensorAttr,
          int numberOfLayers,bool areWeightsQuantized,bool isBiasQuantized)

{
  char *pcVar1;
  Rep *pRVar2;
  Model *pMVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ModelDescription *pMVar8;
  Type *pTVar9;
  FeatureType *pFVar10;
  ArrayFeatureType *pAVar11;
  NeuralNetwork *this;
  Type *this_00;
  long *plVar12;
  TensorAttributes *pTVar13;
  LayerUnion this_01;
  WeightParams *pWVar14;
  QuantizationParams *pQVar15;
  LinearQuantizationParams *pLVar16;
  ulong uVar17;
  long *plVar18;
  long lVar19;
  uint __val;
  int iVar20;
  int iVar21;
  float fVar22;
  undefined7 in_register_00000031;
  undefined4 in_register_00000084;
  undefined3 in_register_00000089;
  long lVar23;
  uint uVar24;
  uint uVar25;
  void **ppvVar26;
  string output;
  string input;
  string layerName;
  undefined1 local_100 [52];
  undefined4 local_cc;
  TensorAttributes *local_c8;
  undefined8 local_c0;
  Model *local_b8;
  uint local_b0;
  undefined4 local_ac;
  NeuralNetwork *local_a8;
  TensorAttributes *local_a0;
  TensorAttributes local_98;
  long local_88;
  long lStack_80;
  TensorAttributes local_78;
  long local_68;
  long lStack_60;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  RepeatedPtrFieldBase *local_38;
  
  local_ac = CONCAT31(in_register_00000089,areWeightsQuantized);
  local_c0 = CONCAT44(in_register_00000084,numberOfLayers);
  local_cc = (undefined4)CONCAT71(in_register_00000031,isUpdatable);
  pMVar8 = m->description_;
  local_c8 = outTensorAttr;
  if (pMVar8 == (ModelDescription *)0x0) {
    pMVar8 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar8);
    m->description_ = pMVar8;
  }
  pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&(pMVar8->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  CoreML::Specification::FeatureDescription::set_name(pTVar9,inTensorAttr->name);
  pFVar10 = pTVar9->type_;
  if (pFVar10 == (FeatureType *)0x0) {
    pFVar10 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar10);
    pTVar9->type_ = pFVar10;
  }
  local_b8 = m;
  if (pFVar10->_oneof_case_[0] == 5) {
    pAVar11 = (pFVar10->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar10);
    pFVar10->_oneof_case_[0] = 5;
    pAVar11 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar11);
    (pFVar10->Type_).multiarraytype_ = pAVar11;
  }
  pAVar11->datatype_ = 0x10020;
  iVar6 = inTensorAttr->dimension;
  local_a0 = inTensorAttr;
  if (0 < iVar6) {
    iVar21 = (pAVar11->shape_).current_size_;
    iVar20 = 0;
    do {
      if (iVar21 == (pAVar11->shape_).total_size_) {
        google::protobuf::RepeatedField<long>::Reserve(&pAVar11->shape_,iVar21 + 1);
        iVar21 = (pAVar11->shape_).current_size_;
        iVar6 = local_a0->dimension;
      }
      lVar19 = (long)iVar21;
      iVar21 = iVar21 + 1;
      (pAVar11->shape_).current_size_ = iVar21;
      ((pAVar11->shape_).rep_)->elements[lVar19] = 1;
      iVar20 = iVar20 + 1;
    } while (iVar20 < iVar6);
  }
  pMVar3 = local_b8;
  pMVar8 = local_b8->description_;
  if (pMVar8 == (ModelDescription *)0x0) {
    pMVar8 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar8);
    pMVar3->description_ = pMVar8;
  }
  pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&(pMVar8->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  CoreML::Specification::FeatureDescription::set_name(pTVar9,local_c8->name);
  pFVar10 = pTVar9->type_;
  if (pFVar10 == (FeatureType *)0x0) {
    pFVar10 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar10);
    pTVar9->type_ = pFVar10;
  }
  if (pFVar10->_oneof_case_[0] == 5) {
    pAVar11 = (pFVar10->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar10);
    pFVar10->_oneof_case_[0] = 5;
    pAVar11 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar11);
    (pFVar10->Type_).multiarraytype_ = pAVar11;
  }
  pAVar11->datatype_ = 0x10020;
  iVar6 = local_c8->dimension;
  if (0 < iVar6) {
    iVar21 = (pAVar11->shape_).current_size_;
    iVar20 = 0;
    do {
      if (iVar21 == (pAVar11->shape_).total_size_) {
        google::protobuf::RepeatedField<long>::Reserve(&pAVar11->shape_,iVar21 + 1);
        iVar21 = (pAVar11->shape_).current_size_;
        iVar6 = local_c8->dimension;
      }
      lVar19 = (long)iVar21;
      iVar21 = iVar21 + 1;
      (pAVar11->shape_).current_size_ = iVar21;
      ((pAVar11->shape_).rep_)->elements[lVar19] = 1;
      iVar20 = iVar20 + 1;
    } while (iVar20 < iVar6);
  }
  pMVar3 = local_b8;
  local_b8->specificationversion_ = 4;
  if (local_b8->_oneof_case_[0] == 500) {
    this = (NeuralNetwork *)(local_b8->Type_).pipelineclassifier_;
  }
  else {
    CoreML::Specification::Model::clear_Type(local_b8);
    pMVar3->_oneof_case_[0] = 500;
    this = (NeuralNetwork *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this);
    (pMVar3->Type_).neuralnetwork_ = this;
  }
  local_a8 = this;
  if (0 < (int)(uint)local_c0) {
    local_38 = &(this->layers_).super_RepeatedPtrFieldBase;
    local_b0 = (uint)local_c0 - 1;
    __val = 0;
    do {
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                          (local_38,(Type *)0x0);
      uVar24 = 1;
      if (9 < __val) {
        uVar17 = (ulong)__val;
        uVar4 = 4;
        do {
          uVar24 = uVar4;
          uVar25 = (uint)uVar17;
          if (uVar25 < 100) {
            uVar24 = uVar24 - 2;
            goto LAB_001b0408;
          }
          if (uVar25 < 1000) {
            uVar24 = uVar24 - 1;
            goto LAB_001b0408;
          }
          if (uVar25 < 10000) goto LAB_001b0408;
          uVar17 = uVar17 / 10000;
          uVar4 = uVar24 + 4;
        } while (99999 < uVar25);
        uVar24 = uVar24 + 1;
      }
LAB_001b0408:
      local_100._0_8_ = local_100 + 0x10;
      std::__cxx11::string::_M_construct((ulong)local_100,(char)uVar24);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_100._0_8_,uVar24,__val);
      plVar12 = (long *)std::__cxx11::string::replace((ulong)local_100,0,(char *)0x0,0x2f3659);
      local_58 = &local_48;
      plVar18 = plVar12 + 2;
      if ((long *)*plVar12 == plVar18) {
        local_48 = *plVar18;
        lStack_40 = plVar12[3];
      }
      else {
        local_48 = *plVar18;
        local_58 = (long *)*plVar12;
      }
      local_50 = plVar12[1];
      *plVar12 = (long)plVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
        operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
      }
      uVar24 = __val - 1;
      uVar4 = -uVar24;
      if (0 < (int)uVar24) {
        uVar4 = uVar24;
      }
      uVar25 = 1;
      if (9 < uVar4) {
        uVar17 = (ulong)uVar4;
        uVar5 = 4;
        do {
          uVar25 = uVar5;
          uVar7 = (uint)uVar17;
          if (uVar7 < 100) {
            uVar25 = uVar25 - 2;
            goto LAB_001b0517;
          }
          if (uVar7 < 1000) {
            uVar25 = uVar25 - 1;
            goto LAB_001b0517;
          }
          if (uVar7 < 10000) goto LAB_001b0517;
          uVar17 = uVar17 / 10000;
          uVar5 = uVar25 + 4;
        } while (99999 < uVar7);
        uVar25 = uVar25 + 1;
      }
LAB_001b0517:
      local_100._0_8_ = local_100 + 0x10;
      std::__cxx11::string::_M_construct
                ((ulong)local_100,(char)uVar25 - (char)((int)uVar24 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)(local_100._0_8_ + (ulong)(uVar24 >> 0x1f)),uVar25,uVar4);
      plVar12 = (long *)std::__cxx11::string::replace((ulong)local_100,0,(char *)0x0,0x31477f);
      local_78.name = (char *)&local_68;
      plVar18 = plVar12 + 2;
      pcVar1 = local_100 + 0x10;
      if ((long *)*plVar12 == plVar18) {
        local_68 = *plVar18;
        lStack_60 = plVar12[3];
      }
      else {
        local_68 = *plVar18;
        local_78.name = (char *)*plVar12;
      }
      local_78._8_8_ = plVar12[1];
      *plVar12 = (long)plVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      if ((char *)local_100._0_8_ != pcVar1) {
        operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
      }
      uVar24 = 1;
      if (9 < __val) {
        uVar17 = (ulong)__val;
        uVar4 = 4;
        do {
          uVar24 = uVar4;
          uVar25 = (uint)uVar17;
          if (uVar25 < 100) {
            uVar24 = uVar24 - 2;
            goto LAB_001b0629;
          }
          if (uVar25 < 1000) {
            uVar24 = uVar24 - 1;
            goto LAB_001b0629;
          }
          if (uVar25 < 10000) goto LAB_001b0629;
          uVar17 = uVar17 / 10000;
          uVar4 = uVar24 + 4;
        } while (99999 < uVar25);
        uVar24 = uVar24 + 1;
      }
LAB_001b0629:
      local_100._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct((ulong)local_100,(char)uVar24);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_100._0_8_,uVar24,__val);
      plVar12 = (long *)std::__cxx11::string::replace((ulong)local_100,0,(char *)0x0,0x31477f);
      local_98.name = (char *)&local_88;
      plVar18 = plVar12 + 2;
      if ((long *)*plVar12 == plVar18) {
        local_88 = *plVar18;
        lStack_80 = plVar12[3];
      }
      else {
        local_88 = *plVar18;
        local_98.name = (char *)*plVar12;
      }
      local_98._8_8_ = plVar12[1];
      *plVar12 = (long)plVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      if ((char *)local_100._0_8_ != pcVar1) {
        operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
      }
      plVar12 = (long *)"inner_layer";
      if ((uint)local_c0 != 1) {
        plVar12 = local_58;
      }
      CoreML::Specification::NeuralNetworkLayer::set_name(this_00,(char *)plVar12);
      pTVar13 = &local_78;
      if (__val == 0) {
        pTVar13 = local_a0;
      }
      CoreML::Specification::NeuralNetworkLayer::add_input(this_00,pTVar13->name);
      pTVar13 = &local_98;
      if (__val == local_b0) {
        pTVar13 = local_c8;
      }
      CoreML::Specification::NeuralNetworkLayer::add_output(this_00,pTVar13->name);
      if (this_00->_oneof_case_[0] == 0x8c) {
        this_01 = this_00->layer_;
      }
      else {
        CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
        this_00->_oneof_case_[0] = 0x8c;
        this_01.convolution_ = (ConvolutionLayerParams *)operator_new(0x38);
        CoreML::Specification::InnerProductLayerParams::InnerProductLayerParams
                  (this_01.innerproduct_);
        (this_00->layer_).innerproduct_ = (InnerProductLayerParams *)this_01;
      }
      (this_01.innerproduct_)->inputchannels_ = 1;
      (this_01.innerproduct_)->outputchannels_ = 1;
      pWVar14 = (WeightParams *)((this_01.activation_)->NonlinearityType_).linear_;
      if (pWVar14 == (WeightParams *)0x0) {
        pWVar14 = (WeightParams *)operator_new(0x50);
        CoreML::Specification::WeightParams::WeightParams(pWVar14);
        ((this_01.activation_)->NonlinearityType_).linear_ = (ActivationLinear *)pWVar14;
      }
      if ((char)local_ac == '\0') {
        fVar22 = (float)(pWVar14->floatvalue_).current_size_;
        if (fVar22 == (float)(pWVar14->floatvalue_).total_size_) {
          google::protobuf::RepeatedField<float>::Reserve(&pWVar14->floatvalue_,(int)fVar22 + 1);
          fVar22 = (float)(pWVar14->floatvalue_).current_size_;
        }
        (pWVar14->floatvalue_).current_size_ = (int)fVar22 + 1;
        ((pWVar14->floatvalue_).rep_)->elements[(int)fVar22] = 1.0;
      }
      else {
        pQVar15 = pWVar14->quantization_;
        if (pQVar15 == (QuantizationParams *)0x0) {
          pQVar15 = (QuantizationParams *)operator_new(0x28);
          CoreML::Specification::QuantizationParams::QuantizationParams(pQVar15);
          pWVar14->quantization_ = pQVar15;
        }
        pQVar15->numberofbits_ = 1;
        if (pQVar15->_oneof_case_[0] == 0x65) {
          pLVar16 = (pQVar15->QuantizationType_).linearquantization_;
        }
        else {
          CoreML::Specification::QuantizationParams::clear_QuantizationType(pQVar15);
          pQVar15->_oneof_case_[0] = 0x65;
          pLVar16 = (LinearQuantizationParams *)operator_new(0x40);
          CoreML::Specification::LinearQuantizationParams::LinearQuantizationParams(pLVar16);
          (pQVar15->QuantizationType_).linearquantization_ = pLVar16;
        }
        iVar6 = (pLVar16->scale_).current_size_;
        if (iVar6 == (pLVar16->scale_).total_size_) {
          google::protobuf::RepeatedField<float>::Reserve(&pLVar16->scale_,iVar6 + 1);
          iVar6 = (pLVar16->scale_).current_size_;
        }
        (pLVar16->scale_).current_size_ = iVar6 + 1;
        ((pLVar16->scale_).rep_)->elements[iVar6] = 1.0;
        iVar6 = (pLVar16->bias_).current_size_;
        if (iVar6 == (pLVar16->bias_).total_size_) {
          google::protobuf::RepeatedField<float>::Reserve(&pLVar16->bias_,iVar6 + 1);
          iVar6 = (pLVar16->bias_).current_size_;
        }
        (pLVar16->bias_).current_size_ = iVar6 + 1;
        ((pLVar16->bias_).rep_)->elements[iVar6] = 0.0;
        local_100._0_8_ = local_100 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"x01","");
        google::protobuf::internal::ArenaStringPtr::SetNoArena
                  (&pWVar14->int8rawvalue_,
                   (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
                   (string *)local_100);
        if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
          operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
        }
      }
      (this_01.innerproduct_)->hasbias_ = true;
      pWVar14 = (this_01.innerproduct_)->bias_;
      if (pWVar14 == (WeightParams *)0x0) {
        pWVar14 = (WeightParams *)operator_new(0x50);
        CoreML::Specification::WeightParams::WeightParams(pWVar14);
        (this_01.innerproduct_)->bias_ = pWVar14;
      }
      if (isBiasQuantized) {
        pQVar15 = pWVar14->quantization_;
        if (pQVar15 == (QuantizationParams *)0x0) {
          pQVar15 = (QuantizationParams *)operator_new(0x28);
          CoreML::Specification::QuantizationParams::QuantizationParams(pQVar15);
          pWVar14->quantization_ = pQVar15;
        }
        pQVar15->numberofbits_ = 1;
        if (pQVar15->_oneof_case_[0] == 0x65) {
          pLVar16 = (pQVar15->QuantizationType_).linearquantization_;
        }
        else {
          CoreML::Specification::QuantizationParams::clear_QuantizationType(pQVar15);
          pQVar15->_oneof_case_[0] = 0x65;
          pLVar16 = (LinearQuantizationParams *)operator_new(0x40);
          CoreML::Specification::LinearQuantizationParams::LinearQuantizationParams(pLVar16);
          (pQVar15->QuantizationType_).linearquantization_ = pLVar16;
        }
        iVar6 = (pLVar16->scale_).current_size_;
        if (iVar6 == (pLVar16->scale_).total_size_) {
          google::protobuf::RepeatedField<float>::Reserve(&pLVar16->scale_,iVar6 + 1);
          iVar6 = (pLVar16->scale_).current_size_;
        }
        (pLVar16->scale_).current_size_ = iVar6 + 1;
        ((pLVar16->scale_).rep_)->elements[iVar6] = 1.0;
        iVar6 = (pLVar16->bias_).current_size_;
        if (iVar6 == (pLVar16->bias_).total_size_) {
          google::protobuf::RepeatedField<float>::Reserve(&pLVar16->bias_,iVar6 + 1);
          iVar6 = (pLVar16->bias_).current_size_;
        }
        (pLVar16->bias_).current_size_ = iVar6 + 1;
        ((pLVar16->bias_).rep_)->elements[iVar6] = 0.0;
        local_100._0_8_ = local_100 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"x01","");
        google::protobuf::internal::ArenaStringPtr::SetNoArena
                  (&pWVar14->int8rawvalue_,
                   (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
                   (string *)local_100);
        if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
          operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
        }
      }
      else {
        iVar6 = (pWVar14->floatvalue_).current_size_;
        if (iVar6 == (pWVar14->floatvalue_).total_size_) {
          google::protobuf::RepeatedField<float>::Reserve(&pWVar14->floatvalue_,iVar6 + 1);
          iVar6 = (pWVar14->floatvalue_).current_size_;
        }
        (pWVar14->floatvalue_).current_size_ = iVar6 + 1;
        ((pWVar14->floatvalue_).rep_)->elements[iVar6] = 1.0;
      }
      if ((char)local_cc != '\0') {
        this_00->isupdatable_ = true;
        pWVar14 = (WeightParams *)((this_01.activation_)->NonlinearityType_).linear_;
        if (pWVar14 == (WeightParams *)0x0) {
          pWVar14 = (WeightParams *)operator_new(0x50);
          CoreML::Specification::WeightParams::WeightParams(pWVar14);
          ((this_01.activation_)->NonlinearityType_).linear_ = (ActivationLinear *)pWVar14;
        }
        pWVar14->isupdatable_ = true;
        pWVar14 = (this_01.innerproduct_)->bias_;
        if (pWVar14 == (WeightParams *)0x0) {
          pWVar14 = (WeightParams *)operator_new(0x50);
          CoreML::Specification::WeightParams::WeightParams(pWVar14);
          (this_01.innerproduct_)->bias_ = pWVar14;
        }
        pWVar14->isupdatable_ = true;
      }
      if ((long *)local_98.name != &local_88) {
        operator_delete(local_98.name,local_88 + 1);
      }
      if ((long *)local_78.name != &local_68) {
        operator_delete(local_78.name,local_68 + 1);
      }
      if (local_58 != &local_48) {
        operator_delete(local_58,local_48 + 1);
      }
      __val = __val + 1;
    } while (__val != (uint)local_c0);
  }
  pMVar3 = local_b8;
  if ((char)local_cc != '\0') {
    local_b8->isupdatable_ = true;
    pMVar8 = local_b8->description_;
    if (pMVar8 == (ModelDescription *)0x0) {
      pMVar8 = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
    }
    pRVar2 = (pMVar8->input_).super_RepeatedPtrFieldBase.rep_;
    ppvVar26 = pRVar2->elements;
    if (pRVar2 == (Rep *)0x0) {
      ppvVar26 = (void **)0x0;
    }
    lVar19 = (long)(pMVar8->input_).super_RepeatedPtrFieldBase.current_size_;
    if (lVar19 != 0) {
      lVar23 = 0;
      do {
        CoreML::Specification::FeatureDescription::FeatureDescription
                  ((FeatureDescription *)local_100,*(FeatureDescription **)((long)ppvVar26 + lVar23)
                  );
        pMVar8 = pMVar3->description_;
        if (pMVar8 == (ModelDescription *)0x0) {
          pMVar8 = (ModelDescription *)operator_new(0x78);
          CoreML::Specification::ModelDescription::ModelDescription(pMVar8);
          pMVar3->description_ = pMVar8;
        }
        pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                           (&(pMVar8->traininginput_).super_RepeatedPtrFieldBase,(Type *)0x0);
        CoreML::Specification::FeatureDescription::CopyFrom(pTVar9,(FeatureDescription *)local_100);
        CoreML::Specification::FeatureDescription::~FeatureDescription
                  ((FeatureDescription *)local_100);
        lVar23 = lVar23 + 8;
      } while (lVar19 * 8 != lVar23);
    }
  }
  return local_a8;
}

Assistant:

Specification::NeuralNetwork* buildBasicNeuralNetworkModel(Specification::Model& m, bool isUpdatable, const TensorAttributes *inTensorAttr, const TensorAttributes *outTensorAttr, int numberOfLayers, bool areWeightsQuantized, bool isBiasQuantized) {
    auto inTensor = m.mutable_description()->add_input();
    inTensor->set_name(inTensorAttr->name);
    auto inTensorShape = inTensor->mutable_type()->mutable_multiarraytype();
    inTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < inTensorAttr->dimension; i++) {
        inTensorShape->add_shape(1);
    }
    
    auto outTensor = m.mutable_description()->add_output();
    outTensor->set_name(outTensorAttr->name);
    auto outTensorShape = outTensor->mutable_type()->mutable_multiarraytype();
    outTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < outTensorAttr->dimension; i++) {
        outTensorShape->add_shape(1);
    }
    
    m.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    
    auto neuralNet = m.mutable_neuralnetwork();
    
    for (int i = 0; i < numberOfLayers; i++) {
        auto layer = neuralNet->add_layers();
        
        std::string layerName = "inner_layer" + std::to_string(i);
        std::string input = "output" + std::to_string(i-1);
        std::string output = "output" + std::to_string(i);
        
        layer->set_name((numberOfLayers == 1) ? "inner_layer" : layerName.c_str());
        layer->add_input((i == 0) ? inTensorAttr->name : input.c_str());
        layer->add_output((i == numberOfLayers-1) ? outTensorAttr->name : output.c_str());
        
        Specification::InnerProductLayerParams *innerProductParams = layer->mutable_innerproduct();
        innerProductParams->set_inputchannels(1);
        innerProductParams->set_outputchannels(1);

        // set weight
        auto* weights = innerProductParams->mutable_weights();
        if (areWeightsQuantized) {
            auto *quant_params = weights->mutable_quantization();
            quant_params->set_numberofbits(1);
            auto *linear_quant_params = quant_params->mutable_linearquantization();
            linear_quant_params->add_scale(1.0f);
            linear_quant_params->add_bias(0.0f);
            weights->set_int8rawvalue("x01"); // this is [1]
        } else {
            weights->add_floatvalue(1.0);
        }

        // set bias
        innerProductParams->set_hasbias(true);
        auto* bias = innerProductParams->mutable_bias();
        if (isBiasQuantized) {
            auto *quant_params = bias->mutable_quantization();
            quant_params->set_numberofbits(1);
            auto *linear_quant_params = quant_params->mutable_linearquantization();
            linear_quant_params->add_scale(1.0f);
            linear_quant_params->add_bias(0.0f);
            bias->set_int8rawvalue("x01"); // this is [1]
        } else {
            bias->add_floatvalue(1.0);
        }
        
        if (isUpdatable) {
            layer->set_isupdatable(true);
            innerProductParams->mutable_weights()->set_isupdatable(true);
            innerProductParams->mutable_bias()->set_isupdatable(true);
        }
    }
    
    if (isUpdatable) {
        m.set_isupdatable(true);
        
        for (auto feature : m.description().input()) {
            auto trainingInput = m.mutable_description()->mutable_traininginput()->Add();
            trainingInput->CopyFrom(feature);
        }
    }
    
    return neuralNet;
}